

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SFMT.cpp
# Opt level: O0

uint __thiscall FRandom::GenRand32(FRandom *this)

{
  int iVar1;
  DWORD r;
  FRandom *this_local;
  
  if ((this->initialized & 1U) != 0) {
    if (0x13 < this->idx) {
      GenRandAll(this);
      this->idx = 0;
    }
    iVar1 = this->idx;
    this->idx = iVar1 + 1;
    return *(uint *)((long)&this->sfmt + (long)iVar1 * 4);
  }
  __assert_fail("initialized",
                "/workspace/llm4binary/github/license_c_cmakelists/alexey-lysiuk[P]gzdoom/src/sfmt/SFMT.cpp"
                ,0x16d,"unsigned int FRandom::GenRand32()");
}

Assistant:

unsigned int FRandom::GenRand32()
{
	DWORD r;

	assert(initialized);
	if (idx >= SFMT::N32)
	{
		GenRandAll();
		idx = 0;
	}
	r = sfmt.u[idx++];
	return r;
}